

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QByteArray,QByteArray>::emplace_helper<QByteArray_const&>
          (QHash<QByteArray,QByteArray> *this,QByteArray *key,QByteArray *args)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  piter pVar4;
  Node<QByteArray,QByteArray> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::findOrInsert<QByteArray>
            ((InsertionResult *)local_38,*(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)this
             ,key);
  this_00 = (Node<QByteArray,QByteArray> *)
            ((((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries)->storage).
             data + (uint)(*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
                          [(uint)local_38._8_8_ & 0x7f] * 0x30);
  if (local_38[0x10] == false) {
    pDVar1 = (key->d).d;
    (key->d).d = (Data *)0x0;
    *(Data **)this_00 = pDVar1;
    pcVar2 = (key->d).ptr;
    (key->d).ptr = (char *)0x0;
    *(char **)(this_00 + 8) = pcVar2;
    qVar3 = (key->d).size;
    (key->d).size = 0;
    *(qsizetype *)(this_00 + 0x10) = qVar3;
    pDVar1 = (args->d).d;
    *(Data **)(this_00 + 0x18) = pDVar1;
    *(char **)(this_00 + 0x20) = (args->d).ptr;
    *(qsizetype *)(this_00 + 0x28) = (args->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    QHashPrivate::Node<QByteArray,QByteArray>::emplaceValue<QByteArray_const&>(this_00,args);
  }
  pVar4.bucket = local_38._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }